

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-domain-socket-server.c
# Opt level: O2

int main(void)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  char *__s;
  socklen_t fromlen;
  sockaddr_un from;
  undefined1 local_20a6 [22];
  undefined8 uStack_2090;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  char buff [8192];
  
  fromlen = 0x6e;
  __fd = socket(1,2,0);
  if (__fd < 0) {
    __s = "socket";
  }
  else {
    local_2048 = 0;
    uStack_2040 = 0;
    local_2058 = 0;
    uStack_2050 = 0;
    local_2068 = 0;
    uStack_2060 = 0;
    local_2078 = 0;
    uStack_2070 = 0;
    local_2088 = 0;
    uStack_2080 = 0;
    local_20a6._14_8_ = 0;
    uStack_2090 = 0;
    local_20a6._0_2_ = 1;
    local_20a6[2] = 's';
    local_20a6[3] = 'e';
    local_20a6[4] = 'r';
    local_20a6[5] = 'v';
    local_20a6[6] = 'e';
    local_20a6[7] = 'r';
    local_20a6[8] = '.';
    local_20a6[9] = 's';
    local_20a6[10] = 'o';
    local_20a6[0xb] = 'c';
    local_20a6[0xc] = 'k';
    local_20a6[0xd] = '\0';
    unlink("server.sock");
    iVar1 = bind(__fd,(sockaddr *)local_20a6,0x6e);
    if (-1 < iVar1) goto LAB_0010124e;
    __s = "bind";
  }
  perror(__s);
LAB_0010124e:
  do {
    sVar2 = recvfrom(__fd,buff,0x2000,0,(sockaddr *)&from,&fromlen);
    if ((int)sVar2 < 1) goto LAB_001012dd;
    printf("recvfrom: %s\n",buff);
    builtin_strncpy(buff,"transmit good!",0xf);
    sVar3 = strlen(buff);
    sVar2 = sendto(__fd,buff,sVar3 + 1,0,(sockaddr *)&from,fromlen);
  } while (-1 < (int)sVar2);
  perror("sendto");
LAB_001012dd:
  if (-1 < __fd) {
    close(__fd);
  }
  return 0;
}

Assistant:

int main() {
    int fd;
    struct sockaddr_un addr;
    int ret;
    char buff[8192];
    struct sockaddr_un from;
    int ok = 1;
    int len;
    socklen_t fromlen = sizeof(from);
    
    //////********* UNIX domain  *********//////////
    ///// UNIX domain sockets are a method by which processes on the same host can communicate. 
    /////Communication is bidirectional with stream sockets and unidirectional with datagram sockets.
    
    // i.e fd = socket(AF_UNIX, SOCK_STREAM, 0);
    
    /// PF= Protocol family: Unix domain sockets  PF_UNIX=AF_UNIX
    //NOTE: SOCK_DGRAM socket datagram type communication.
    if ((fd = socket(PF_UNIX, SOCK_DGRAM, 0)) < 0) {
        perror("socket");
        ok = 0;
    }

    if (ok) {
        
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = server.sock
        strcpy(addr.sun_path, SERVER_SOCK_FILE);
        // unlink() - delete name and if it's possible the file which is referring for by the name.
        unlink(SERVER_SOCK_FILE);
        //// int bind (int fd, const struct sockaddr *addr, int addrlen)
        ////  link the socket using the file descriptor a local or a network Address, memorized into addr.
        if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
            perror("bind");
            ok = 0;
        }
    }
    
    /// With the SOCK SOCK_DGRAM option it's possibile use the recvfrom function with more details.
    ////ssize_t recvfrom(int sockfd, void *buf, size_t len, int flags, struct sockaddr *src_addr, socklen_t *addrlen);
    while ((len = recvfrom(fd, buff, 8192, 0, (struct sockaddr *)&from, &fromlen)) > 0) {
        printf ("recvfrom: %s\n", buff);
        strcpy (buff, "transmit good!");
        /// With the SOCK SOCK_DGRAM option it's possibile use the sendto function with more details.
        /// ssize_t sendto(int sockfd, const void *buf, size_t len, int flags,const struct sockaddr *dest_addr, socklen_t addrlen);
        ret = sendto(fd, buff, strlen(buff)+1, 0, (struct sockaddr *)&from, fromlen);
        if (ret < 0) {
            perror("sendto");
            break;
        }
    }
    

    if (fd >= 0) {
        close(fd);
    }

    return 0;
}